

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityID.h
# Opt level: O0

void __thiscall DIS::EntityID::EntityID(EntityID *this,EntityID *param_1)

{
  unsigned_short uVar1;
  EntityID *param_1_local;
  EntityID *this_local;
  
  this->_vptr_EntityID = (_func_int **)&PTR__EntityID_00271ca8;
  uVar1 = param_1->_application;
  this->_site = param_1->_site;
  this->_application = uVar1;
  this->_entity = param_1->_entity;
  return;
}

Assistant:

class OPENDIS6_EXPORT EntityID
{
protected:
  /** The site ID */
  unsigned short _site; 

  /** The application ID */
  unsigned short _application; 

  /** the entity ID */
  unsigned short _entity; 


 public:
    EntityID();
    virtual ~EntityID();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    unsigned short getSite() const; 
    void setSite(unsigned short pX); 

    unsigned short getApplication() const; 
    void setApplication(unsigned short pX); 

    unsigned short getEntity() const; 
    void setEntity(unsigned short pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const EntityID& rhs) const;
}